

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

StartsWith * __thiscall
Catch::Matchers::Impl::StdString::StartsWith::toString_abi_cxx11_(StartsWith *this)

{
  string local_38 [40];
  StartsWith *this_local;
  
  this_local = this;
  std::operator+((char *)local_38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "starts with: \"");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)local_38);
  std::__cxx11::string::~string(local_38);
  return this;
}

Assistant:

virtual std::string toString() const {
                return "starts with: \"" + m_substr + "\"";
            }